

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O0

parser_error parse_summon_unique(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  wchar_t unique;
  summon *s;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    wVar1 = parser_getint(p,"allowed");
    if (wVar1 != L'\0') {
      *(undefined1 *)((long)pvVar2 + 0x14) = 1;
    }
    return PARSE_ERROR_NONE;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-summon.c"
                ,0x5b,"enum parser_error parse_summon_unique(struct parser *)");
}

Assistant:

static enum parser_error parse_summon_unique(struct parser *p) {
	struct summon *s = parser_priv(p);
	int unique = 0;
	assert(s);
	unique = parser_getint(p, "allowed");
	if (unique) {
		s->unique_allowed = true;
	}
	return PARSE_ERROR_NONE;
}